

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

void __thiscall
pmx::PmxVertexSkinningSDEF::Read(PmxVertexSkinningSDEF *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  PmxSetting *setting_local;
  istream *stream_local;
  PmxVertexSkinningSDEF *this_local;
  
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->bone_index1 = iVar1;
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->bone_index2 = iVar1;
  std::istream::read((char *)stream,(long)&this->bone_weight);
  std::istream::read((char *)stream,(long)this->sdef_c);
  std::istream::read((char *)stream,(long)this->sdef_r0);
  std::istream::read((char *)stream,(long)this->sdef_r1);
  return;
}

Assistant:

void PmxVertexSkinningSDEF::Read(std::istream *stream, PmxSetting *setting)
	{
		this->bone_index1 = ReadIndex(stream, setting->bone_index_size);
		this->bone_index2 = ReadIndex(stream, setting->bone_index_size);
		stream->read((char*) &this->bone_weight, sizeof(float));
		stream->read((char*) this->sdef_c, sizeof(float) * 3);
		stream->read((char*) this->sdef_r0, sizeof(float) * 3);
		stream->read((char*) this->sdef_r1, sizeof(float) * 3);
	}